

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFieldValueFromString
          (Parser *this,string *input,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 local_170 [8];
  ParserImpl parser;
  ArrayInputStream input_stream;
  
  io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&parser.had_errors_,(input->_M_dataplus)._M_p,
             (int)input->_M_string_length,-1);
  iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[0x13])(output);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_170,(Descriptor *)CONCAT44(extraout_var,iVar2),
             (ZeroCopyInputStream *)&parser.had_errors_,this->error_collector_,this->finder_,
             this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,this->allow_case_insensitive_field_,
             this->allow_unknown_field_,this->allow_unknown_extension_,this->allow_unknown_enum_,
             this->allow_field_number_,this->allow_relaxed_whitespace_,this->allow_partial_,
             this->recursion_limit_);
  bVar1 = ParserImpl::ParseField((ParserImpl *)local_170,field,output);
  io::Tokenizer::~Tokenizer((Tokenizer *)&parser.tokenizer_error_collector_.parser_);
  io::ErrorCollector::~ErrorCollector((ErrorCollector *)&parser.parse_info_tree_);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFieldValueFromString(const std::string& input,
                                                   const FieldDescriptor* field,
                                                   Message* output) {
  io::ArrayInputStream input_stream(input.data(), input.size());
  ParserImpl parser(
      output->GetDescriptor(), &input_stream, error_collector_, finder_,
      parse_info_tree_, ParserImpl::ALLOW_SINGULAR_OVERWRITES,
      allow_case_insensitive_field_, allow_unknown_field_,
      allow_unknown_extension_, allow_unknown_enum_, allow_field_number_,
      allow_relaxed_whitespace_, allow_partial_, recursion_limit_);
  return parser.ParseField(field, output);
}